

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_ABCfunctions.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_ABCfunctions::~ChFunctionRotation_ABCfunctions
          (ChFunctionRotation_ABCfunctions *this)

{
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_ABCfunctions_01192ba0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->angleC).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->angleB).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->angleA).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ChFunctionRotation_ABCfunctions::~ChFunctionRotation_ABCfunctions() {

}